

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O1

int __thiscall bsim::quad_value_bit_vector::to_type<int>(quad_value_bit_vector *this)

{
  int iVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  
  if ((long)this->N < 1) {
    iVar1 = 0;
  }
  else {
    lVar2 = 0;
    iVar3 = 1;
    iVar1 = 0;
    do {
      uVar4 = (uint)(this->bits).
                    super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar2].value;
      if (1 < uVar4) {
        __assert_fail("(value == 1) || (value == 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0x78,"unsigned char bsim::quad_value::binary_value() const");
      }
      iVar1 = iVar1 + uVar4 * iVar3;
      iVar3 = iVar3 * 2;
      lVar2 = lVar2 + 1;
    } while (this->N != lVar2);
  }
  return iVar1;
}

Assistant:

ConvType to_type() const {
      ConvType tmp = 0;
      ConvType exp = 1;
      for (int i = 0; i < bitLength(); i++) {
        tmp += exp*get(i).binary_value();
        exp *= 2;
      }
      return tmp;
      // ConvType tmp = *(const_cast<ConvType*>((const ConvType*) (&(bits[0]))));
      // //TODO FIXME I am a sketchy hack.
      // ConvType mask = sizeof(ConvType) > bits.size() ? (1<<N)-1 : -1; 
      // return tmp & mask;
    }